

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

Item * Lib::List<Inferences::URResolution::Item_*>::pop
                 (List<Inferences::URResolution::Item_*> **lst)

{
  List<Inferences::URResolution::Item_*> *pLVar1;
  Item *pIVar2;
  undefined8 *in_RDI;
  Item *result;
  List<Inferences::URResolution::Item_*> *tail;
  size_t in_stack_ffffffffffffffd8;
  
  pLVar1 = List<Inferences::URResolution::Item_*>::tail
                     ((List<Inferences::URResolution::Item_*> *)*in_RDI);
  pIVar2 = head((List<Inferences::URResolution::Item_*> *)*in_RDI);
  if ((void *)*in_RDI != (void *)0x0) {
    List<Inferences::URResolution::Item*>::operator_delete
              ((void *)*in_RDI,in_stack_ffffffffffffffd8);
  }
  *in_RDI = pLVar1;
  return pIVar2;
}

Assistant:

static C pop(List* &lst)
  {
    ASS_NEQ(lst,0);

    List* tail = lst->tail();
    C result = lst->head();
    delete lst;
    lst = tail;

    return result;
  }